

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O0

void __thiscall
spvtools::opt::analysis::DefUseManager::AnalyzeInstDefUse(DefUseManager *this,Instruction *inst)

{
  bool bVar1;
  vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *this_00;
  reference inst_00;
  Instruction *l_inst;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *__range2;
  Instruction *inst_local;
  DefUseManager *this_local;
  
  AnalyzeInstDef(this,inst);
  AnalyzeInstUse(this,inst);
  this_00 = opt::Instruction::dbg_line_insts(inst);
  __end2 = std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::
           begin(this_00);
  l_inst = (Instruction *)
           std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::end
                     (this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>_>
                                *)&l_inst);
    if (!bVar1) break;
    inst_00 = __gnu_cxx::
              __normal_iterator<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>_>
              ::operator*(&__end2);
    AnalyzeInstDefUse(this,inst_00);
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void DefUseManager::AnalyzeInstDefUse(Instruction* inst) {
  AnalyzeInstDef(inst);
  AnalyzeInstUse(inst);
  // Analyze lines last otherwise they will be cleared when inst is
  // cleared by preceding two calls
  for (auto& l_inst : inst->dbg_line_insts()) AnalyzeInstDefUse(&l_inst);
}